

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_modifier_suite.cpp
# Opt level: O0

void erase_suite::erase_range_array_second_fourth(void)

{
  iterator *piVar1;
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *piVar2;
  size_type in_RCX;
  const_iterator *last;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  basic_variable<std::allocator<char>_> *local_2e8;
  basic_variable<std::allocator<char>_> *local_2b0;
  iterator local_2a0;
  iterator local_288;
  iterator local_270;
  iterator local_258;
  basic_variable<std::allocator<char>_> *local_240;
  basic_variable<std::allocator<char>_> local_238;
  basic_variable<std::allocator<char>_> local_208;
  undefined1 local_1d8 [24];
  variable expect;
  const_iterator local_180;
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_168;
  const_iterator local_150;
  undefined1 local_138 [8];
  iterator where;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_108,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_d8,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_a8,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_78,"alpha");
  local_48._0_8_ = &local_108;
  local_48._8_8_ = 4;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x4;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_2b0 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_2b0 = local_2b0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_2b0);
  } while (local_2b0 != &local_108);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            ((iterator *)&local_168,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  piVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator++(&local_168);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::const_iterator
            (&local_150,piVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            ((iterator *)&expect.storage.field_0x28,
             (basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  piVar2 = &trial::dynamic::basic_variable<std::allocator<char>_>::
            iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
            ::operator++((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                          *)&expect.storage.field_0x28)->
            super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ;
  piVar2 = &trial::dynamic::basic_variable<std::allocator<char>_>::
            iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
            ::operator++(piVar2)->
            super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ;
  piVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator++(piVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::const_iterator
            (&local_180,piVar1);
  last = &local_180;
  trial::dynamic::basic_variable<std::allocator<char>_>::erase
            ((iterator *)local_138,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             &local_150,last);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_180)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)&expect.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_150)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)&local_168)
  ;
  local_240 = &local_238;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_240,true);
  local_240 = &local_208;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_240,"alpha");
  local_1d8._0_8_ = &local_238;
  local_1d8._8_8_ = 2;
  init_00._M_len = (size_type)last;
  init_00._M_array = (iterator)0x2;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1d8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_1d8._0_8_,init_00);
  local_2e8 = (basic_variable<std::allocator<char>_> *)local_1d8;
  do {
    local_2e8 = local_2e8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_2e8);
  } while (local_2e8 != &local_238);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_258,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_270,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_288,(basic_variable<std::allocator<char>_> *)(local_1d8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_2a0,(basic_variable<std::allocator<char>_> *)(local_1d8 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x603,"void erase_suite::erase_range_array_second_fourth()",&local_258,&local_270,
             &local_288,&local_2a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_288);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_270);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_258);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1d8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_138);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void erase_range_array_second_fourth()
{
    variable data = array::make({ true, 2, 3.0, "alpha" });
    auto where = data.erase(++data.begin(), ++(++(++data.begin())));
    variable expect = array::make({ true, "alpha" });
    TRIAL_PROTOCOL_TEST_ALL_WITH(data.begin(), data.end(),
                                 expect.begin(), expect.end(),
                                 std::equal_to<variable>());
}